

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

int doprinuse(void)

{
  boolean bVar1;
  long lVar2;
  obj *obj;
  int iVar3;
  char lets [53];
  char local_48 [56];
  
  if (invent != (obj *)0x0) {
    iVar3 = 0;
    obj = invent;
    do {
      if (((obj->owornmask & 0x1f077fU) != 0) || (bVar1 = tool_in_use(obj), bVar1 != '\0')) {
        lVar2 = (long)iVar3;
        iVar3 = iVar3 + 1;
        local_48[lVar2] = obj->invlet;
      }
      obj = obj->nobj;
    } while (obj != (obj *)0x0);
    local_48[iVar3] = '\0';
    if (iVar3 != 0) {
      display_pickinv(local_48,'\0',(long *)0x0);
      return 0;
    }
  }
  pline("You are not wearing or wielding anything.");
  return 0;
}

Assistant:

int doprinuse(void)
{
	struct obj *otmp;
	int ct = 0;
	char lets[52+1];

	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_worn(otmp) || tool_in_use(otmp))
		lets[ct++] = obj_to_let(otmp);
	lets[ct] = '\0';
	if (!ct) pline("You are not wearing or wielding anything.");
	else display_inventory(lets, FALSE);
	return 0;
}